

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_mac_verify_finish(psa_mac_operation_t *operation,uint8_t *mac,size_t mac_length)

{
  byte bVar1;
  psa_status_t pVar2;
  psa_status_t pVar3;
  size_t sVar4;
  uint8_t actual_mac [64];
  byte local_68 [64];
  
  pVar3 = -0x89;
  if ((operation->alg != 0) && ((operation->field_0x4 & 0x10) == 0)) {
    pVar2 = -0x95;
    if ((operation->mac_size == mac_length) &&
       (pVar2 = psa_mac_finish_internal(operation,local_68,0x40), pVar2 == 0)) {
      if (mac_length == 0) {
        pVar2 = 0;
      }
      else {
        bVar1 = 0;
        sVar4 = 0;
        do {
          bVar1 = bVar1 | local_68[sVar4] ^ mac[sVar4];
          sVar4 = sVar4 + 1;
        } while (mac_length != sVar4);
        pVar2 = -0x95;
        if (bVar1 == 0) {
          pVar2 = 0;
        }
      }
    }
    pVar3 = psa_mac_abort(operation);
    if (pVar2 != 0) {
      pVar3 = pVar2;
    }
    mbedtls_platform_zeroize(local_68,0x40);
  }
  return pVar3;
}

Assistant:

psa_status_t psa_mac_verify_finish( psa_mac_operation_t *operation,
                                    const uint8_t *mac,
                                    size_t mac_length )
{
    uint8_t actual_mac[PSA_MAC_MAX_SIZE];
    psa_status_t status;

    if( operation->alg == 0 )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    if( operation->is_sign )
    {
        return( PSA_ERROR_BAD_STATE );
    }
    if( operation->mac_size != mac_length )
    {
        status = PSA_ERROR_INVALID_SIGNATURE;
        goto cleanup;
    }

    status = psa_mac_finish_internal( operation,
                                      actual_mac, sizeof( actual_mac ) );
    if( status != PSA_SUCCESS )
        goto cleanup;

    if( safer_memcmp( mac, actual_mac, mac_length ) != 0 )
        status = PSA_ERROR_INVALID_SIGNATURE;

cleanup:
    if( status == PSA_SUCCESS )
        status = psa_mac_abort( operation );
    else
        psa_mac_abort( operation );

    mbedtls_platform_zeroize( actual_mac, sizeof( actual_mac ) );

    return( status );
}